

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O0

void __thiscall amrex::DistributionMapping::DistributionMapping(DistributionMapping *this)

{
  std::make_shared<amrex::DistributionMapping::Ref>();
  return;
}

Assistant:

DistributionMapping::DistributionMapping ()
    :
    m_ref(std::make_shared<Ref>())
{
}